

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O0

void __thiscall wallet::CWalletTx::Serialize<DataStream>(CWalletTx *this,DataStream *s)

{
  DataStream *this_00;
  DataStream *obj;
  long in_RDI;
  long in_FS_OFFSET;
  int serializedIndex;
  bool dummy_bool;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dummy_vector2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dummy_vector1;
  uint256 serializedHash;
  mapValue_t mapValueCopy;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_>
  *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  key_type *in_stack_fffffffffffffe08;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  long *in_stack_fffffffffffffe20;
  allocator<char> *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  allocator<char> local_fb;
  allocator<char> local_fa;
  allocator<char> local_f9 [241];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)in_stack_fffffffffffffde8,
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x179d549);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffde8);
  std::allocator<char>::~allocator(local_f9);
  if (*(long *)(in_RDI + 0x58) != -1) {
    util::ToString<long>(in_stack_fffffffffffffe20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    std::__cxx11::string::~string(in_stack_fffffffffffffde8);
    std::allocator<char>::~allocator(&local_fa);
    std::__cxx11::string::~string(in_stack_fffffffffffffde8);
  }
  if (*(int *)(in_RDI + 0x50) != 0) {
    tinyformat::format<unsigned_int>(in_stack_fffffffffffffe18,(uint *)in_stack_fffffffffffffe10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    std::__cxx11::string::~string(in_stack_fffffffffffffde8);
    std::allocator<char>::~allocator(&local_fb);
    std::__cxx11::string::~string(in_stack_fffffffffffffde8);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffde8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffde8);
  TxStateSerializedBlockHash((TxState *)in_stack_fffffffffffffdf0);
  TxStateSerializedIndex((TxState *)in_stack_fffffffffffffdf0);
  TransactionSerParams::operator()
            ((TransactionSerParams *)in_stack_fffffffffffffdf8,
             (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffdf0);
  DataStream::operator<<((DataStream *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffffdf8,(uint256 *)in_stack_fffffffffffffdf0);
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffffdf8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf0);
  DataStream::operator<<((DataStream *)in_stack_fffffffffffffdf8,(int *)in_stack_fffffffffffffdf0);
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffffdf8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf0);
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffffdf8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffdf0);
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffffdf8,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffdf0);
  DataStream::operator<<((DataStream *)in_stack_fffffffffffffdf8,(uint *)in_stack_fffffffffffffdf0);
  this_00 = DataStream::operator<<
                      ((DataStream *)in_stack_fffffffffffffdf8,(uint *)in_stack_fffffffffffffdf0);
  obj = DataStream::operator<<(this_00,(bool *)in_stack_fffffffffffffdf0);
  DataStream::operator<<(this_00,(bool *)obj);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_fffffffffffffde8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const
    {
        mapValue_t mapValueCopy = mapValue;

        mapValueCopy["fromaccount"] = "";
        if (nOrderPos != -1) {
            mapValueCopy["n"] = util::ToString(nOrderPos);
        }
        if (nTimeSmart) {
            mapValueCopy["timesmart"] = strprintf("%u", nTimeSmart);
        }

        std::vector<uint8_t> dummy_vector1; //!< Used to be vMerkleBranch
        std::vector<uint8_t> dummy_vector2; //!< Used to be vtxPrev
        bool dummy_bool = false; //!< Used to be fSpent
        uint256 serializedHash = TxStateSerializedBlockHash(m_state);
        int serializedIndex = TxStateSerializedIndex(m_state);
        s << TX_WITH_WITNESS(tx) << serializedHash << dummy_vector1 << serializedIndex << dummy_vector2 << mapValueCopy << vOrderForm << fTimeReceivedIsTxTime << nTimeReceived << fFromMe << dummy_bool;
    }